

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::AccessorVerifier::SetTracker
          (AccessorVerifier *this,bool *v,undefined1 new_value)

{
  Nullable<const_char_*> failure_msg;
  bool local_41;
  LogMessage local_40;
  string local_30;
  
  local_41 = (bool)new_value;
  failure_msg = absl::lts_20250127::log_internal::Check_NEImpl<bool,bool>
                          (v,&local_41,"v != new_value");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    *v = local_41;
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
             ,0x4f9,failure_msg);
  cpp::(anonymous_namespace)::AccessorVerifier::Error_abi_cxx11_(&local_30,this);
  absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void SetTracker(bool& v, bool new_value, SourceLocation loc) {
    ABSL_CHECK_NE(v, new_value) << Error(loc);
    v = new_value;
  }